

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::FboCases::IntersectingQuadsTest::IntersectingQuadsTest
          (IntersectingQuadsTest *this,Context *context,FboConfig *config,bool npot)

{
  int iVar1;
  undefined7 in_register_00000009;
  bool *__s;
  allocator<char> local_81;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __s = glcts::fixed_sample_locations_values + 1;
  if ((int)CONCAT71(in_register_00000009,npot) != 0) {
    __s = (bool *)0x1828313;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_81);
  FboConfig::getName_abi_cxx11_(&local_80,config);
  std::operator+(&local_40,&local_60,&local_80);
  FboRenderCase::FboRenderCase
            (&this->super_FboRenderCase,context,local_40._M_dataplus._M_p,
             "Intersecting textured quads",config);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  (this->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e1b508;
  this->m_fboWidth = 0x80 - (uint)npot;
  iVar1 = 0x5f;
  if (!npot) {
    iVar1 = 0x80;
  }
  this->m_fboHeight = iVar1;
  return;
}

Assistant:

IntersectingQuadsTest::IntersectingQuadsTest (Context& context, const FboConfig& config, bool npot)
	: FboRenderCase	(context, (string(npot ? "npot_" : "") + config.getName()).c_str(), "Intersecting textured quads", config)
	, m_fboWidth	(npot ? 127 : 128)
	, m_fboHeight	(npot ?  95 : 128)
{
}